

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O3

void __thiscall S1Interval::AddPoint(S1Interval *this,double p)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  S2LogMessage SStack_18;
  
  if (3.141592653589793 < ABS(p)) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0xa5,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (fabs(p)) <= (3.14159265358979323846) ",0x34);
    goto LAB_0019bfff;
  }
  dVar7 = (double)(~-(ulong)(p != -3.141592653589793) & 0x400921fb54442d18 |
                  (ulong)p & -(ulong)(p != -3.141592653589793));
  dVar3 = (this->bounds_).c_[0];
  dVar4 = (this->bounds_).c_[1];
  if (dVar3 <= dVar4) {
    if ((dVar3 <= dVar7) && (dVar7 <= dVar4)) {
      return;
    }
  }
  else if ((dVar3 <= dVar7) || (dVar7 <= dVar4)) {
    if (dVar3 != 3.141592653589793) {
      return;
    }
    if (NAN(dVar3)) {
      return;
    }
    if (dVar4 != -3.141592653589793) {
      return;
    }
    if (NAN(dVar4)) {
      return;
    }
  }
  if ((((dVar3 != 3.141592653589793) || (NAN(dVar3))) || (dVar4 != -3.141592653589793)) ||
     (NAN(dVar4))) {
    uVar5 = -(ulong)(dVar3 - dVar7 < 0.0);
    uVar6 = -(ulong)(dVar7 - dVar4 < 0.0);
    uVar2 = (ulong)((dVar7 + 3.141592653589793) - (dVar4 + -3.141592653589793)) & uVar6;
    auVar8._0_8_ = ~uVar5 & (ulong)(dVar3 - dVar7);
    auVar8._8_8_ = ~uVar6 & (ulong)(dVar7 - dVar4);
    auVar1._8_4_ = (int)uVar2;
    auVar1._0_8_ = (ulong)((dVar3 + 3.141592653589793) - (dVar7 + -3.141592653589793)) & uVar5;
    auVar1._12_4_ = (int)(uVar2 >> 0x20);
    if (SUB168(auVar8 | auVar1,8) <= SUB168(auVar8 | auVar1,0)) {
      (this->bounds_).c_[1] = dVar7;
      if ((3.141592653589793 < ABS(dVar3)) ||
         (((dVar7 != 3.141592653589793 || (NAN(dVar7))) &&
          ((dVar3 == -3.141592653589793 && (!NAN(dVar3))))))) {
        S2LogMessage::S2LogMessage
                  (&SStack_18,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                   ,0x103,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (SStack_18.stream_,"Check failed: is_valid() ",0x19);
        goto LAB_0019bfff;
      }
    }
    else {
      (this->bounds_).c_[0] = dVar7;
      if ((3.141592653589793 < ABS(dVar4)) ||
         (((dVar7 != 3.141592653589793 || (NAN(dVar7))) &&
          ((dVar4 == -3.141592653589793 && (!NAN(dVar4))))))) {
        S2LogMessage::S2LogMessage
                  (&SStack_18,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                   ,0xfe,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (SStack_18.stream_,"Check failed: is_valid() ",0x19);
LAB_0019bfff:
        abort();
      }
    }
  }
  else {
    (this->bounds_).c_[1] = dVar7;
    (this->bounds_).c_[0] = dVar7;
  }
  return;
}

Assistant:

void S1Interval::AddPoint(double p) {
  S2_DCHECK_LE(fabs(p), M_PI);
  if (p == -M_PI) p = M_PI;

  if (FastContains(p)) return;
  if (is_empty()) {
    set_hi(p);
    set_lo(p);
  } else {
    // Compute distance from p to each endpoint.
    double dlo = PositiveDistance(p, lo());
    double dhi = PositiveDistance(hi(), p);
    if (dlo < dhi) {
      set_lo(p);
    } else {
      set_hi(p);
    }
    // Adding a point can never turn a non-full interval into a full one.
  }
}